

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::operator==(LE_EulerAngles *this,LE_EulerAngles *Value)

{
  KBOOL KVar1;
  KFIXED<char,_(unsigned_char)__x03_> local_58;
  KFIXED<char,_(unsigned_char)__x03_> local_48;
  KFIXED<char,_(unsigned_char)__x03_> local_38;
  
  local_38.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00215be8;
  local_38.m_Val = (Value->m_Psi).m_Val;
  KVar1 = KFIXED<char,_(unsigned_char)'\x03'>::operator!=(&this->m_Psi,&local_38);
  DataTypeBase::~DataTypeBase(&local_38.super_DataTypeBase);
  if (!KVar1) {
    local_48.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00215be8;
    local_48.m_Val = (Value->m_Theta).m_Val;
    KVar1 = KFIXED<char,_(unsigned_char)'\x03'>::operator!=(&this->m_Theta,&local_48);
    DataTypeBase::~DataTypeBase(&local_48.super_DataTypeBase);
    if (!KVar1) {
      local_58.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00215be8;
      local_58.m_Val = (Value->m_Phi).m_Val;
      KVar1 = KFIXED<char,_(unsigned_char)'\x03'>::operator!=(&this->m_Phi,&local_58);
      DataTypeBase::~DataTypeBase(&local_58.super_DataTypeBase);
      return !KVar1;
    }
  }
  return false;
}

Assistant:

KBOOL LE_EulerAngles::operator == ( const LE_EulerAngles & Value ) const
{
    if( m_Psi    != Value.m_Psi )     return false;
    if( m_Theta  != Value.m_Theta )   return false;
    if( m_Phi    != Value.m_Phi )     return false;
    return true;
}